

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

float stbtt__position_trapezoid_area(float height,float tx0,float tx1,float bx0,float bx1)

{
  if (tx1 - tx0 < 0.0) {
    __assert_fail("top_width >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                  ,0xbfb,"float stbtt__sized_trapezoid_area(float, float, float)");
  }
  if (0.0 <= bx1 - bx0) {
    return ((tx1 - tx0) + (bx1 - bx0)) * 0.5 * height;
  }
  __assert_fail("bottom_width >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                ,0xbfc,"float stbtt__sized_trapezoid_area(float, float, float)");
}

Assistant:

static float stbtt__position_trapezoid_area(float height, float tx0, float tx1, float bx0, float bx1)
{
   return stbtt__sized_trapezoid_area(height, tx1 - tx0, bx1 - bx0);
}